

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall gl3cts::TransformFeedback::DrawXFBFeedback::clean(DrawXFBFeedback *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  bool bVar5;
  long lVar3;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0x1680))(0);
  if (this->m_program_id != 0) {
    (**(code **)(lVar3 + 0x448))();
    this->m_program_id = 0;
  }
  if (this->m_xfb_id != 0) {
    (**(code **)(lVar3 + 0x488))(1,&this->m_xfb_id);
    this->m_xfb_id = 0;
  }
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar5 = bVar1;
    if (this->m_bo_id[lVar4] != 0) {
      (**(code **)(lVar3 + 0x438))(1,this->m_bo_id + lVar4);
      this->m_bo_id[lVar4] = 0;
    }
    lVar4 = 1;
    bVar1 = false;
  } while (bVar5);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar5 = bVar1;
    if (this->m_vao_id[lVar4] != 0) {
      (**(code **)(lVar3 + 0x490))(1,this->m_vao_id + lVar4);
      this->m_vao_id[lVar4] = 0;
    }
    lVar4 = 1;
    bVar1 = false;
  } while (bVar5);
  return;
}

Assistant:

void gl3cts::TransformFeedback::DrawXFBFeedback::clean()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(0);

	if (m_program_id)
	{
		gl.deleteProgram(m_program_id);

		m_program_id = 0;
	}

	if (m_xfb_id)
	{
		gl.deleteTransformFeedbacks(1, &m_xfb_id);

		m_xfb_id = 0;
	}

	for (glw::GLuint i = 0; i < s_bo_count; ++i)
	{
		if (m_bo_id[i])
		{
			gl.deleteBuffers(1, &m_bo_id[i]);

			m_bo_id[i] = 0;
		}
	}

	for (glw::GLuint i = 0; i < s_bo_count; ++i)
	{
		if (m_vao_id[i])
		{
			gl.deleteVertexArrays(1, &m_vao_id[i]);

			m_vao_id[i] = 0;
		}
	}
}